

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

void __thiscall
xemmai::ast::t_lambda::f_safe_points
          (t_lambda *this,t_code *a_code,
          map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
          *a_safe_points,
          vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
          *a_safe_positions)

{
  size_t this_00;
  bool bVar1;
  int iVar2;
  map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
  *pmVar3;
  reference ppVar4;
  t_symbol *ptVar5;
  wstring *pwVar6;
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long,_unsigned_long>_> *__x;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long,_unsigned_long>_> *p_Var7;
  __tuple_element_t<2UL,_tuple<unsigned_long,_unsigned_long,_unsigned_long>_> *__args_1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>_>,_bool>
  pVar8;
  pair<unsigned_long,_void_**> pVar9;
  reference local_178;
  pair<unsigned_long,_void_**> local_170;
  tuple<unsigned_long,_unsigned_long,_unsigned_long> *local_160;
  tuple<unsigned_long,_unsigned_long,_unsigned_long> *x;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  *__range2_1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_130;
  reference local_110;
  pair<xemmai::t_object_*const,_xemmai::t_code::t_variable> *pair_1;
  iterator __end3;
  iterator __begin3;
  map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
  *__range3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_e0;
  t_scope *local_b0;
  t_scope *scope;
  wstring prefix;
  pair<xemmai::t_object_*const,_xemmai::t_code::t_variable> *pair;
  iterator __end2;
  iterator __begin2;
  map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
  *__range2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_48;
  undefined1 local_38 [8];
  t_variable self;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  *a_safe_positions_local;
  map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
  *a_safe_points_local;
  t_code *a_code_local;
  t_lambda *this_local;
  
  self.v_index = (size_t)a_safe_positions;
  t_code::t_variable::t_variable((t_variable *)local_38);
  local_38[0] = (bool)((this->super_t_scope).v_self_shared & 1);
  iVar2 = -1;
  if (((this->super_t_scope).v_self_shared & 1U) != 0) {
    iVar2 = 0;
  }
  self._0_8_ = SEXT48(iVar2);
  local_48 = sv(L"$",1);
  std::
  map<std::__cxx11::wstring,xemmai::t_code::t_variable,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
  ::emplace<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,xemmai::t_code::t_variable&>
            ((map<std::__cxx11::wstring,xemmai::t_code::t_variable,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
              *)&a_code->v_variables,&local_48,(t_variable *)local_38);
  pmVar3 = &(this->super_t_scope).v_variables;
  __end2 = std::
           map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
           ::begin(pmVar3);
  pair = (pair<xemmai::t_object_*const,_xemmai::t_code::t_variable> *)
         std::
         map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
         ::end(pmVar3);
  while( true ) {
    bVar1 = std::operator==(&__end2,(_Self *)&pair);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>
             ::operator*(&__end2);
    ptVar5 = t_object::f_as<xemmai::t_symbol>(ppVar4->first);
    pwVar6 = t_symbol::f_string_abi_cxx11_(ptVar5);
    pVar8 = std::
            map<std::__cxx11::wstring,xemmai::t_code::t_variable,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
            ::emplace<std::__cxx11::wstring_const&,xemmai::t_code::t_variable&>
                      ((map<std::__cxx11::wstring,xemmai::t_code::t_variable,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
                        *)&a_code->v_variables,pwVar6,&ppVar4->second);
    prefix.field_2._8_8_ = pVar8.first._M_node;
    std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>::
    operator++(&__end2);
  }
  std::__cxx11::wstring::wstring((wstring *)&scope);
  local_38[0] = true;
  self.v_shared = false;
  self.v_varies = false;
  self._2_6_ = 0;
  for (local_b0 = (this->super_t_scope).v_outer; this_00 = self.v_index, local_b0 != (t_scope *)0x0;
      local_b0 = local_b0->v_outer) {
    std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
    operator+=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&scope,
               L':');
    if ((local_b0->v_self_shared & 1U) != 0) {
      std::operator+(&local_e0,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     &scope,L'$');
      std::
      map<std::__cxx11::wstring,xemmai::t_code::t_variable,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
      ::emplace<std::__cxx11::wstring,xemmai::t_code::t_variable&>
                ((map<std::__cxx11::wstring,xemmai::t_code::t_variable,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
                  *)&a_code->v_variables,&local_e0,(t_variable *)local_38);
      std::__cxx11::wstring::~wstring((wstring *)&local_e0);
    }
    pmVar3 = &local_b0->v_variables;
    __end3 = std::
             map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
             ::begin(pmVar3);
    pair_1 = (pair<xemmai::t_object_*const,_xemmai::t_code::t_variable> *)
             std::
             map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
             ::end(pmVar3);
    while( true ) {
      bVar1 = std::operator==(&__end3,(_Self *)&pair_1);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_110 = std::
                  _Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>
                  ::operator*(&__end3);
      if (((local_110->second).v_shared & 1U) != 0) {
        ptVar5 = t_object::f_as<xemmai::t_symbol>(local_110->first);
        pwVar6 = t_symbol::f_string_abi_cxx11_(ptVar5);
        std::operator+(&local_130,
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )&scope,pwVar6);
        std::
        map<std::__cxx11::wstring,xemmai::t_code::t_variable,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
        ::emplace<std::__cxx11::wstring,xemmai::t_code::t_variable&>
                  ((map<std::__cxx11::wstring,xemmai::t_code::t_variable,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
                    *)&a_code->v_variables,&local_130,&local_110->second);
        std::__cxx11::wstring::~wstring((wstring *)&local_130);
      }
      std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>::
      operator++(&__end3);
    }
  }
  __end2_1 = std::
             vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
             ::begin((vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                      *)self.v_index);
  x = (tuple<unsigned_long,_unsigned_long,_unsigned_long> *)
      std::
      vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
      ::end((vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
             *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>
                      (&__end2_1,
                       (__normal_iterator<const_std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>
                        *)&x);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_160 = __gnu_cxx::
                __normal_iterator<const_std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>
                ::operator*(&__end2_1);
    __x = std::get<0ul,unsigned_long,unsigned_long,unsigned_long>(local_160);
    p_Var7 = std::get<1ul,unsigned_long,unsigned_long,unsigned_long>(local_160);
    local_178 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&a_code->v_instructions,*p_Var7);
    pVar9 = std::make_pair<unsigned_long_const&,void**>(__x,&local_178);
    local_170 = pVar9;
    __args_1 = std::get<2ul,unsigned_long,unsigned_long,unsigned_long>(local_160);
    std::
    map<std::pair<unsigned_long,void**>,unsigned_long,std::less<std::pair<unsigned_long,void**>>,std::allocator<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>>
    ::emplace<std::pair<unsigned_long,void**>,unsigned_long_const&>
              ((map<std::pair<unsigned_long,void**>,unsigned_long,std::less<std::pair<unsigned_long,void**>>,std::allocator<std::pair<std::pair<unsigned_long,void**>const,unsigned_long>>>
                *)a_safe_points,&local_170,__args_1);
    __gnu_cxx::
    __normal_iterator<const_std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>
    ::operator++(&__end2_1);
  }
  std::__cxx11::wstring::~wstring((wstring *)&scope);
  return;
}

Assistant:

void t_lambda::f_safe_points(t_code& a_code, std::map<std::pair<size_t, void**>, size_t>& a_safe_points, const std::vector<std::tuple<size_t, size_t, size_t>>& a_safe_positions)
{
	t_code::t_variable self;
	self.v_shared = v_self_shared;
	self.v_index = v_self_shared ? 0 : -1;
	a_code.v_variables.emplace(L"$"sv, self);
	for (auto& pair : v_variables) a_code.v_variables.emplace(pair.first->f_as<t_symbol>().f_string(), pair.second);
	std::wstring prefix;
	self.v_shared = true;
	self.v_index = 0;
	for (auto scope = v_outer; scope; scope = scope->v_outer) {
		prefix += L':';
		if (scope->v_self_shared) a_code.v_variables.emplace(prefix + L'$', self);
		for (auto& pair : scope->v_variables) if (pair.second.v_shared) a_code.v_variables.emplace(prefix + pair.first->f_as<t_symbol>().f_string(), pair.second);
	}
	for (auto& x : a_safe_positions) a_safe_points.emplace(std::make_pair(std::get<0>(x), &a_code.v_instructions[std::get<1>(x)]), std::get<2>(x));
}